

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

size_t * map_get_keys(pMap map)

{
  size_t *res;
  pMap map_local;
  
  map_local = (pMap)malloc(map->count << 3);
  if (map_local == (pMap)0x0) {
    perror("map_get_keys: malloc failed");
    map_local = (pMap)0x0;
  }
  else {
    memcpy(map_local,map->keys,map->count << 3);
  }
  return &map_local->count;
}

Assistant:

size_t *map_get_keys(pMap map)
{
    size_t *res = malloc(map->count * sizeof(size_t));
    if (res == NULL)
    {
        perror("map_get_keys: malloc failed");
        return 0;
    }
    memcpy(res, map->keys, map->count * sizeof(size_t));
    return res;
}